

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O0

size_t ZSTD_buildCTable(void *dst,size_t dstCapacity,FSE_CTable *nextCTable,U32 FSELog,
                       symbolEncodingType_e type,uint *count,U32 max,BYTE *codeTable,size_t nbSeq,
                       S16 *defaultNorm,U32 defaultNormLog,U32 defaultMax,FSE_CTable *prevCTable,
                       size_t prevCTableSize,void *entropyWorkspace,size_t entropyWorkspaceSize)

{
  uint uVar1;
  uint uVar2;
  void *code;
  size_t err_code_4;
  size_t err_code_3;
  size_t NCountSize;
  size_t err_code_2;
  size_t sStack_68;
  U32 tableLog;
  size_t nbSeq_1;
  ZSTD_BuildCTableWksp *wksp;
  size_t err_code_1;
  size_t err_code;
  BYTE *oend;
  BYTE *op;
  uint *count_local;
  symbolEncodingType_e type_local;
  U32 FSELog_local;
  FSE_CTable *nextCTable_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  switch(type) {
  case set_basic:
    dst_local = (void *)FSE_buildCTable_wksp
                                  (nextCTable,defaultNorm,defaultMax,defaultNormLog,entropyWorkspace
                                   ,entropyWorkspaceSize);
    uVar1 = ERR_isError((size_t)dst_local);
    if (uVar1 == 0) {
      dst_local = (void *)0x0;
    }
    break;
  case set_rle:
    dst_local = (void *)FSE_buildCTable_rle(nextCTable,(BYTE)max);
    uVar1 = ERR_isError((size_t)dst_local);
    if (uVar1 == 0) {
      if (dstCapacity == 0) {
        dst_local = (void *)0xffffffffffffffba;
      }
      else {
        *(BYTE *)dst = *codeTable;
        dst_local = (void *)0x1;
      }
    }
    break;
  case set_compressed:
    sStack_68 = nbSeq;
    uVar1 = FSE_optimalTableLog(FSELog,nbSeq,max);
    if (1 < count[codeTable[nbSeq - 1]]) {
      count[codeTable[nbSeq - 1]] = count[codeTable[nbSeq - 1]] - 1;
      sStack_68 = nbSeq - 1;
    }
    uVar2 = ZSTD_useLowProbCount(sStack_68);
    dst_local = (void *)FSE_normalizeCount((short *)entropyWorkspace,uVar1,count,sStack_68,max,uVar2
                                          );
    uVar2 = ERR_isError((size_t)dst_local);
    if (uVar2 == 0) {
      dst_local = (void *)FSE_writeNCount(dst,dstCapacity,(short *)entropyWorkspace,max,uVar1);
      uVar2 = ERR_isError((size_t)dst_local);
      if (uVar2 == 0) {
        code = (void *)FSE_buildCTable_wksp
                                 (nextCTable,(short *)entropyWorkspace,max,uVar1,
                                  (void *)((long)entropyWorkspace + 0x6c),0x2d8);
        uVar1 = ERR_isError((size_t)code);
        if (uVar1 != 0) {
          dst_local = code;
        }
      }
    }
    break;
  case set_repeat:
    memcpy(nextCTable,prevCTable,prevCTableSize);
    dst_local = (void *)0x0;
    break;
  default:
    dst_local = (void *)0xffffffffffffffff;
  }
  return (size_t)dst_local;
}

Assistant:

size_t
ZSTD_buildCTable(void* dst, size_t dstCapacity,
                FSE_CTable* nextCTable, U32 FSELog, symbolEncodingType_e type,
                unsigned* count, U32 max,
                const BYTE* codeTable, size_t nbSeq,
                const S16* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                const FSE_CTable* prevCTable, size_t prevCTableSize,
                void* entropyWorkspace, size_t entropyWorkspaceSize)
{
    BYTE* op = (BYTE*)dst;
    const BYTE* const oend = op + dstCapacity;
    DEBUGLOG(6, "ZSTD_buildCTable (dstCapacity=%u)", (unsigned)dstCapacity);

    switch (type) {
    case set_rle:
        FORWARD_IF_ERROR(FSE_buildCTable_rle(nextCTable, (BYTE)max), "");
        RETURN_ERROR_IF(dstCapacity==0, dstSize_tooSmall, "not enough space");
        *op = codeTable[0];
        return 1;
    case set_repeat:
        ZSTD_memcpy(nextCTable, prevCTable, prevCTableSize);
        return 0;
    case set_basic:
        FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, defaultNorm, defaultMax, defaultNormLog, entropyWorkspace, entropyWorkspaceSize), "");  /* note : could be pre-calculated */
        return 0;
    case set_compressed: {
        ZSTD_BuildCTableWksp* wksp = (ZSTD_BuildCTableWksp*)entropyWorkspace;
        size_t nbSeq_1 = nbSeq;
        const U32 tableLog = FSE_optimalTableLog(FSELog, nbSeq, max);
        if (count[codeTable[nbSeq-1]] > 1) {
            count[codeTable[nbSeq-1]]--;
            nbSeq_1--;
        }
        assert(nbSeq_1 > 1);
        assert(entropyWorkspaceSize >= sizeof(ZSTD_BuildCTableWksp));
        (void)entropyWorkspaceSize;
        FORWARD_IF_ERROR(FSE_normalizeCount(wksp->norm, tableLog, count, nbSeq_1, max, ZSTD_useLowProbCount(nbSeq_1)), "");
        {   size_t const NCountSize = FSE_writeNCount(op, oend - op, wksp->norm, max, tableLog);   /* overflow protected */
            FORWARD_IF_ERROR(NCountSize, "FSE_writeNCount failed");
            FORWARD_IF_ERROR(FSE_buildCTable_wksp(nextCTable, wksp->norm, max, tableLog, wksp->wksp, sizeof(wksp->wksp)), "");
            return NCountSize;
        }
    }
    default: assert(0); RETURN_ERROR(GENERIC, "impossible to reach");
    }
}